

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O2

void __thiscall miniros::CallbackQueue::disable(CallbackQueue *this)

{
  std::mutex::lock(&this->mutex_);
  this->enabled_ = false;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void CallbackQueue::disable()
{
  std::scoped_lock<std::mutex> lock(mutex_);
  enabled_ = false;

  condition_.notify_all();
}